

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O2

void __thiscall
sf::priv::RenderTextureImplFBO::updateTexture(RenderTextureImplFBO *this,uint param_1)

{
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  Lock lock;
  Uint64 contextId;
  
  if (((this->m_multisample == true) && (this->m_width != 0)) && (this->m_height != 0)) {
    iVar1 = (*(this->super_RenderTextureImpl)._vptr_RenderTextureImpl[3])(this,1);
    if ((char)iVar1 != '\0') {
      contextId = Context::getActiveContextId();
      Lock::Lock(&lock,(Mutex *)&(anonymous_namespace)::mutex);
      iVar2 = std::
              _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long_long,_unsigned_int>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
              ::find(&(this->m_frameBuffers)._M_t,&contextId);
      iVar3 = std::
              _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long_long,_unsigned_int>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
              ::find(&(this->m_multisampleFrameBuffers)._M_t,&contextId);
      if ((_Rb_tree_header *)iVar3._M_node !=
          &(this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header &&
          (_Rb_tree_header *)iVar2._M_node !=
          &(this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header) {
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca9,*(GLuint *)&iVar2._M_node[1]._M_parent);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x251,"GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, iter->second)");
        (*sf_ptrc_glBlitFramebufferEXT)
                  (0,0,this->m_width,this->m_height,0,0,this->m_width,this->m_height,0x4000,0x2600);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x252,
                     "GLEXT_glBlitFramebuffer(0, 0, m_width, m_height, 0, 0, m_width, m_height, GL_COLOR_BUFFER_BIT, GL_NEAREST)"
                    );
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca9,*(GLuint *)&iVar3._M_node[1]._M_parent);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x253,
                     "GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, multisampleIter->second)");
      }
      Lock::~Lock(&lock);
    }
  }
  return;
}

Assistant:

void RenderTextureImplFBO::updateTexture(unsigned int)
{
    // If multisampling is enabled, we need to resolve by blitting
    // from our FBO with multisample renderbuffer attachments
    // to our FBO to which our target texture is attached

#ifndef SFML_OPENGL_ES

    // In case of multisampling, make sure both FBOs
    // are already available within the current context
    if (m_multisample && m_width && m_height && activate(true))
    {
        Uint64 contextId = Context::getActiveContextId();

        Lock lock(mutex);

        std::map<Uint64, unsigned int>::iterator iter = m_frameBuffers.find(contextId);
        std::map<Uint64, unsigned int>::iterator multisampleIter = m_multisampleFrameBuffers.find(contextId);

        if ((iter != m_frameBuffers.end()) && (multisampleIter != m_multisampleFrameBuffers.end()))
        {
            // Set up the blit target (draw framebuffer) and blit (from the read framebuffer, our multisample FBO)
            glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, iter->second));
            glCheck(GLEXT_glBlitFramebuffer(0, 0, m_width, m_height, 0, 0, m_width, m_height, GL_COLOR_BUFFER_BIT, GL_NEAREST));
            glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, multisampleIter->second));
        }
    }

#endif // SFML_OPENGL_ES

}